

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_adds_u_b_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  byte *pbVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  
  lVar4 = (ulong)wd * 0x10;
  lVar6 = (ulong)ws * 0x10;
  lVar5 = (ulong)wt * 0x10;
  bVar3 = *(byte *)((env->active_fpu).fpr + wt);
  pfVar1 = (env->active_fpu).fpr + ws;
  cVar7 = bVar3 + *(byte *)pfVar1;
  if (CARRY1(bVar3,*(byte *)pfVar1)) {
    cVar7 = -1;
  }
  *(char *)((env->active_fpu).fpr + wd) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 1);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 1);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 1) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 2);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 2);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 2) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 3);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 3);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 3) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 4);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 4);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 4) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 5);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 5);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 5) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 6);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 6);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 6) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 7);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 7);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 7) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 8);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 8);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 8) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 9);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 9);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 9) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 10);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 10);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 10) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 0xb);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 0xb);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 0xb) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 0xc);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 0xc);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 0xc) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 0xd);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 0xd);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 0xd) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 0xe);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 0xe);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 0xe) = cVar7;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 0xf);
  pbVar2 = (byte *)((long)(env->active_fpu).fpr + lVar6 + 0xf);
  cVar7 = bVar3 + *pbVar2;
  if (CARRY1(bVar3,*pbVar2)) {
    cVar7 = -1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar4 + 0xf) = cVar7;
  return;
}

Assistant:

void helper_msa_adds_u_b(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_adds_u_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_adds_u_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_adds_u_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_adds_u_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_adds_u_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_adds_u_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_adds_u_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_adds_u_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_adds_u_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_adds_u_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_adds_u_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_adds_u_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_adds_u_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_adds_u_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_adds_u_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_adds_u_df(DF_BYTE, pws->b[15], pwt->b[15]);
}